

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O2

int mbedtls_ssl_write_record(mbedtls_ssl_context *ssl,int force_flush)

{
  mbedtls_ssl_protocol_version mVar1;
  byte *pbVar2;
  mbedtls_ssl_config *pmVar3;
  uint uVar4;
  uchar *puVar5;
  uint uVar6;
  int line;
  uint8_t uVar7;
  ushort uVar8;
  ushort uVar9;
  ulong uVar10;
  char *text;
  size_t sVar11;
  uchar *len;
  undefined1 local_60 [8];
  mbedtls_record rec;
  
  sVar11 = ssl->out_msglen;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,0xb84,"=> write record");
  mVar1 = ssl->tls_version;
  uVar6 = (mVar1 == 0x302 | 0x200) - mVar1;
  uVar8 = (ushort)uVar6;
  uVar9 = (ushort)mVar1;
  if (ssl->conf->transport == '\x01') {
    uVar9 = uVar8;
  }
  *(ushort *)(ssl->out_hdr + 1) = uVar9 << 8 | uVar9 >> 8;
  *(undefined8 *)ssl->out_ctr = *(undefined8 *)ssl->cur_out_ctr;
  uVar9 = (ushort)sVar11;
  *(ushort *)ssl->out_len = uVar9 << 8 | uVar9 >> 8;
  if (ssl->transform_out == (mbedtls_ssl_transform *)0x0) {
LAB_00186a81:
    puVar5 = ssl->out_hdr;
    len = ssl->out_iv + (sVar11 - (long)puVar5);
    if (ssl->conf->transport == '\x01') {
      uVar6 = ssl_get_remaining_space_in_datagram(ssl);
      if ((int)uVar6 < 0) {
        return uVar6;
      }
      if ((uchar *)(ulong)uVar6 < len) {
        return -0x6c00;
      }
      puVar5 = ssl->out_hdr;
    }
    *puVar5 = (uchar)ssl->out_msgtype;
    pbVar2 = ssl->out_hdr;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0xbdb,"output record: msgtype = %u, version = [%u:%u], msglen = %zu",(ulong)*pbVar2,
               (ulong)pbVar2[1],(ulong)pbVar2[2],sVar11);
    mbedtls_debug_print_buf
              (ssl,4,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0xbde,"output record sent to network",ssl->out_hdr,(size_t)len);
    ssl->out_left = (size_t)(len + ssl->out_left);
    ssl->out_hdr = ssl->out_hdr + (long)len;
    mbedtls_ssl_update_out_pointers(ssl,ssl->transform_out);
    pmVar3 = ssl->conf;
    uVar6 = 7;
    do {
      uVar4 = uVar6 + 1;
      uVar7 = pmVar3->transport;
      if (uVar4 <= (uint)(uVar7 == '\x01') * 2) goto LAB_00186b86;
      uVar10 = (ulong)uVar6;
      uVar6 = uVar6 - 1;
      puVar5 = ssl->cur_out_ctr + uVar10;
      *puVar5 = *puVar5 + '\x01';
    } while (*puVar5 == '\0');
    uVar7 = pmVar3->transport;
LAB_00186b86:
    if ((uint)(uVar7 == '\x01') * 2 == uVar4) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0xbec,"outgoing message counter would wrap");
      return -0x6b80;
    }
    if (force_flush == 0 && uVar7 == '\x01') {
      uVar6 = ssl_get_remaining_payload_in_datagram(ssl);
      if ((int)uVar6 < 0) {
        text = "ssl_get_remaining_payload_in_datagram";
        line = 0xbf8;
        goto LAB_00186a1c;
      }
      if (uVar6 == 0) goto LAB_00186c0f;
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0xc02,"Still %u bytes available in current datagram",(ulong)uVar6);
    }
    else if (force_flush == 1) {
LAB_00186c0f:
      uVar6 = mbedtls_ssl_flush_output(ssl);
      if (uVar6 != 0) {
        text = "mbedtls_ssl_flush_output";
        line = 0xc09;
        goto LAB_00186a1c;
      }
    }
    uVar6 = 0;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0xc0d,"<= write record");
  }
  else {
    rec._8_8_ = ssl->out_iv;
    rec.buf = ssl->out_buf + (0x42d - rec._8_8_);
    rec.data_offset = ssl->out_msglen;
    rec.buf_len = (size_t)(ssl->out_msg + -rec._8_8_);
    local_60 = *(undefined1 (*) [8])ssl->out_ctr;
    uVar9 = (ushort)mVar1;
    if (ssl->conf->transport == '\x01') {
      uVar9 = uVar8;
    }
    rec.ctr._1_2_ = uVar9 << 8 | uVar9 >> 8;
    rec.ctr[0] = (uint8_t)ssl->out_msgtype;
    uVar6 = mbedtls_ssl_encrypt_buf
                      (ssl,ssl->transform_out,(mbedtls_record *)local_60,
                       (mbedtls_ssl_recv_t *)(ulong)uVar6,(void *)rec.buf_len);
    if (uVar6 == 0) {
      if (rec.buf_len != 0) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0xbb6,"should never happen");
        return -0x6c00;
      }
      ssl->out_msgtype = (uint)rec.ctr[0];
      ssl->out_msglen = rec.data_offset;
      *(ushort *)ssl->out_len = (ushort)rec.data_offset << 8 | (ushort)rec.data_offset >> 8;
      sVar11 = rec.data_offset;
      goto LAB_00186a81;
    }
    text = "ssl_encrypt_buf";
    line = 0xbb1;
LAB_00186a1c:
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,line,text,uVar6);
  }
  return uVar6;
}

Assistant:

int mbedtls_ssl_write_record(mbedtls_ssl_context *ssl, int force_flush)
{
    int ret, done = 0;
    size_t len = ssl->out_msglen;
    int flush = force_flush;

    MBEDTLS_SSL_DEBUG_MSG(2, ("=> write record"));

    if (!done) {
        unsigned i;
        size_t protected_record_size;
#if defined(MBEDTLS_SSL_VARIABLE_BUFFER_LENGTH)
        size_t out_buf_len = ssl->out_buf_len;
#else
        size_t out_buf_len = MBEDTLS_SSL_OUT_BUFFER_LEN;
#endif
        /* Skip writing the record content type to after the encryption,
         * as it may change when using the CID extension. */
        mbedtls_ssl_protocol_version tls_ver = ssl->tls_version;
#if defined(MBEDTLS_SSL_PROTO_TLS1_3)
        /* TLS 1.3 still uses the TLS 1.2 version identifier
         * for backwards compatibility. */
        if (tls_ver == MBEDTLS_SSL_VERSION_TLS1_3) {
            tls_ver = MBEDTLS_SSL_VERSION_TLS1_2;
        }
#endif /* MBEDTLS_SSL_PROTO_TLS1_3 */
        mbedtls_ssl_write_version(ssl->out_hdr + 1, ssl->conf->transport,
                                  tls_ver);

        memcpy(ssl->out_ctr, ssl->cur_out_ctr, MBEDTLS_SSL_SEQUENCE_NUMBER_LEN);
        MBEDTLS_PUT_UINT16_BE(len, ssl->out_len, 0);

        if (ssl->transform_out != NULL) {
            mbedtls_record rec;

            rec.buf         = ssl->out_iv;
            rec.buf_len     = out_buf_len - (ssl->out_iv - ssl->out_buf);
            rec.data_len    = ssl->out_msglen;
            rec.data_offset = ssl->out_msg - rec.buf;

            memcpy(&rec.ctr[0], ssl->out_ctr, sizeof(rec.ctr));
            mbedtls_ssl_write_version(rec.ver, ssl->conf->transport, tls_ver);
            rec.type = ssl->out_msgtype;

#if defined(MBEDTLS_SSL_DTLS_CONNECTION_ID)
            /* The CID is set by mbedtls_ssl_encrypt_buf(). */
            rec.cid_len = 0;
#endif /* MBEDTLS_SSL_DTLS_CONNECTION_ID */

            if ((ret = mbedtls_ssl_encrypt_buf(ssl, ssl->transform_out, &rec,
                                               ssl->conf->f_rng, ssl->conf->p_rng)) != 0) {
                MBEDTLS_SSL_DEBUG_RET(1, "ssl_encrypt_buf", ret);
                return ret;
            }

            if (rec.data_offset != 0) {
                MBEDTLS_SSL_DEBUG_MSG(1, ("should never happen"));
                return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
            }

            /* Update the record content type and CID. */
            ssl->out_msgtype = rec.type;
#if defined(MBEDTLS_SSL_DTLS_CONNECTION_ID)
            memcpy(ssl->out_cid, rec.cid, rec.cid_len);
#endif /* MBEDTLS_SSL_DTLS_CONNECTION_ID */
            ssl->out_msglen = len = rec.data_len;
            MBEDTLS_PUT_UINT16_BE(rec.data_len, ssl->out_len, 0);
        }

        protected_record_size = len + mbedtls_ssl_out_hdr_len(ssl);

#if defined(MBEDTLS_SSL_PROTO_DTLS)
        /* In case of DTLS, double-check that we don't exceed
         * the remaining space in the datagram. */
        if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM) {
            ret = ssl_get_remaining_space_in_datagram(ssl);
            if (ret < 0) {
                return ret;
            }

            if (protected_record_size > (size_t) ret) {
                /* Should never happen */
                return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
            }
        }
#endif /* MBEDTLS_SSL_PROTO_DTLS */

        /* Now write the potentially updated record content type. */
        ssl->out_hdr[0] = (unsigned char) ssl->out_msgtype;

        MBEDTLS_SSL_DEBUG_MSG(3, ("output record: msgtype = %u, "
                                  "version = [%u:%u], msglen = %" MBEDTLS_PRINTF_SIZET,
                                  ssl->out_hdr[0], ssl->out_hdr[1],
                                  ssl->out_hdr[2], len));

        MBEDTLS_SSL_DEBUG_BUF(4, "output record sent to network",
                              ssl->out_hdr, protected_record_size);

        ssl->out_left += protected_record_size;
        ssl->out_hdr  += protected_record_size;
        mbedtls_ssl_update_out_pointers(ssl, ssl->transform_out);

        for (i = 8; i > mbedtls_ssl_ep_len(ssl); i--) {
            if (++ssl->cur_out_ctr[i - 1] != 0) {
                break;
            }
        }

        /* The loop goes to its end if the counter is wrapping */
        if (i == mbedtls_ssl_ep_len(ssl)) {
            MBEDTLS_SSL_DEBUG_MSG(1, ("outgoing message counter would wrap"));
            return MBEDTLS_ERR_SSL_COUNTER_WRAPPING;
        }
    }

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        flush == SSL_DONT_FORCE_FLUSH) {
        size_t remaining;
        ret = ssl_get_remaining_payload_in_datagram(ssl);
        if (ret < 0) {
            MBEDTLS_SSL_DEBUG_RET(1, "ssl_get_remaining_payload_in_datagram",
                                  ret);
            return ret;
        }

        remaining = (size_t) ret;
        if (remaining == 0) {
            flush = SSL_FORCE_FLUSH;
        } else {
            MBEDTLS_SSL_DEBUG_MSG(2,
                                  ("Still %u bytes available in current datagram",
                                   (unsigned) remaining));
        }
    }
#endif /* MBEDTLS_SSL_PROTO_DTLS */

    if ((flush == SSL_FORCE_FLUSH) &&
        (ret = mbedtls_ssl_flush_output(ssl)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "mbedtls_ssl_flush_output", ret);
        return ret;
    }

    MBEDTLS_SSL_DEBUG_MSG(2, ("<= write record"));

    return 0;
}